

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall
QL_Manager::Select(QL_Manager *this,int nSelAttrs,RelAttr *selAttrs,int nRelations,char **relations,
                  int nConditions,Condition *conditions)

{
  char *__s;
  QL_Node *topNode_00;
  RC RVar1;
  RC RVar2;
  ostream *poVar3;
  size_t sVar4;
  QL_Manager *pQVar5;
  RelCatEntry *relEntries;
  AttrCatEntry *pAVar6;
  QO_Manager *this_00;
  QO_Rel *relOrder;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  RelAttr *pRVar10;
  Condition *c;
  long lVar11;
  float tupleEst;
  RelAttr *local_88;
  float cost;
  undefined4 uStack_7c;
  long local_78;
  undefined1 local_70 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_60;
  QL_Node *topNode;
  int local_38;
  
  local_88 = selAttrs;
  if (this->smm->printPageStats == true) {
    SM_Manager::ResetPageStats(this->smm);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Select\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   nSelAttrs = ",0xf);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,nSelAttrs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (0 < nSelAttrs) {
    uVar8 = 0;
    pRVar10 = local_88;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   selAttrs[",0xc);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]:",2);
      poVar3 = operator<<(poVar3,pRVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      uVar8 = uVar8 + 1;
      pRVar10 = pRVar10 + 1;
    } while ((uint)nSelAttrs != uVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   nRelations = ",0x10);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,nRelations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (0 < nRelations) {
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relations[",0xd);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
      __s = relations[uVar8];
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      uVar8 = uVar8 + 1;
    } while ((uint)nRelations != uVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   nCondtions = ",0x10);
  pQVar5 = (QL_Manager *)std::ostream::operator<<(&std::cout,nConditions);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pQVar5,"\n",1);
  if (0 < nConditions) {
    uVar8 = 0;
    c = conditions;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   conditions[",0xe)
      ;
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]:",2);
      pQVar5 = (QL_Manager *)operator<<(poVar3,c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pQVar5,"\n",1);
      uVar8 = uVar8 + 1;
      c = c + 1;
    } while ((uint)nConditions != uVar8);
  }
  RVar1 = ParseRelNoDup(pQVar5,nRelations,relations);
  if (RVar1 != 0) {
    return RVar1;
  }
  Reset(this);
  this->nRels = nRelations;
  this->nConds = nConditions;
  this->condptr = conditions;
  relEntries = (RelCatEntry *)malloc((long)nRelations * 0x34);
  this->relEntries = relEntries;
  relEntries->relName[0] = '\0';
  relEntries->relName[1] = '\0';
  relEntries->relName[2] = '\0';
  relEntries->relName[3] = '\0';
  relEntries->relName[4] = '\0';
  relEntries->relName[5] = '\0';
  relEntries->relName[6] = '\0';
  relEntries->relName[7] = '\0';
  relEntries->relName[8] = '\0';
  relEntries->relName[9] = '\0';
  relEntries->relName[10] = '\0';
  relEntries->relName[0xb] = '\0';
  relEntries->relName[0xc] = '\0';
  relEntries->relName[0xd] = '\0';
  relEntries->relName[0xe] = '\0';
  relEntries->relName[0xf] = '\0';
  relEntries->relName[0x10] = '\0';
  relEntries->relName[0x11] = '\0';
  relEntries->relName[0x12] = '\0';
  relEntries->relName[0x13] = '\0';
  relEntries->relName[0x14] = '\0';
  relEntries->relName[0x15] = '\0';
  relEntries->relName[0x16] = '\0';
  relEntries->relName[0x17] = '\0';
  *(undefined8 *)(relEntries->relName + 0x18) = 0;
  relEntries->attrCount = 0;
  relEntries->indexCount = 0;
  relEntries->indexCurrNum = 0;
  relEntries->numTuples = 0;
  *(undefined4 *)&relEntries->statsInitialized = 0;
  RVar1 = SM_Manager::GetAllRels
                    (this->smm,relEntries,nRelations,relations,&this->nAttrs,&this->relToInt);
  if (RVar1 == 0) {
    pAVar6 = (AttrCatEntry *)malloc((long)this->nAttrs * 0x54);
    this->attrEntries = pAVar6;
    if (0 < nRelations) {
      local_60 = &this->attrToRel;
      lVar11 = 0;
      iVar9 = 0;
      RVar1 = 0;
      do {
        std::__cxx11::string::string
                  ((string *)&cost,this->relEntries->relName + lVar11,(allocator *)&topNode);
        topNode = (QL_Node *)&stack0xffffffffffffffb8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&topNode,CONCAT44(uStack_7c,cost),local_78 + CONCAT44(uStack_7c,cost));
        local_38 = iVar9;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)&this->relToAttrIndex,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)&topNode);
        if (topNode != (QL_Node *)&stack0xffffffffffffffb8) {
          operator_delete(topNode);
        }
        RVar2 = SM_Manager::GetAttrForRel
                          (this->smm,(RelCatEntry *)(this->relEntries->relName + lVar11),
                           this->attrEntries + iVar9,local_60);
        if (RVar2 == 0) {
          iVar9 = iVar9 + *(int *)(this->relEntries->relName + lVar11 + 0x20);
        }
        else {
          free(this->relEntries);
          free(this->attrEntries);
          RVar1 = RVar2;
        }
        if ((undefined1 *)CONCAT44(uStack_7c,cost) != local_70) {
          operator_delete((undefined1 *)CONCAT44(uStack_7c,cost));
        }
        if (RVar2 != 0) {
          return RVar1;
        }
        lVar11 = lVar11 + 0x34;
      } while ((ulong)(uint)nRelations * 0x34 != lVar11);
    }
    pRVar10 = local_88;
    RVar1 = ParseSelectAttrs(this,nSelAttrs,local_88);
    if ((RVar1 == 0) && (RVar1 = ParseConditions(this,nConditions,conditions), RVar1 == 0)) {
      if (this->smm->useQO == true) {
        this_00 = (QO_Manager *)operator_new(0x48);
        QO_Manager::QO_Manager
                  (this_00,this,this->nRels,this->relEntries,this->nAttrs,this->attrEntries,
                   this->nConds,this->condptr);
        iVar9 = this->nRels;
        sVar4 = (long)iVar9 * 0xc;
        relOrder = (QO_Rel *)malloc(sVar4);
        if (0 < (long)iVar9) {
          sVar7 = 0;
          do {
            *(undefined8 *)((long)&relOrder->relIdx + sVar7) = 0xffffffff00000000;
            *(undefined4 *)((long)&relOrder->indexCond + sVar7) = 0xffffffff;
            sVar7 = sVar7 + 0xc;
          } while (sVar4 != sVar7);
        }
        QO_Manager::Compute(this_00,relOrder,&cost,&tupleEst);
        QO_Manager::PrintRels(this_00);
        RecalcCondToRel(this,relOrder);
        RVar1 = SetUpNodesWithQO(this,&topNode,relOrder,nSelAttrs,pRVar10);
        if (RVar1 != 0) {
          return RVar1;
        }
        QO_Manager::~QO_Manager(this_00);
        operator_delete(this_00);
        free(relOrder);
      }
      else {
        RVar1 = SetUpNodes(this,&topNode,nSelAttrs,pRVar10);
        if (RVar1 != 0) {
          return RVar1;
        }
      }
      topNode_00 = topNode;
      pQVar5 = this;
      RVar1 = RunSelect(this,topNode);
      if (RVar1 != 0) {
        return RVar1;
      }
      if (this->smm->useQO == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"estimated cost: ",0x10);
        poVar3 = std::ostream::_M_insert<double>((double)cost);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"estimated # tuples: ",0x14);
        pQVar5 = (QL_Manager *)std::ostream::_M_insert<double>((double)tupleEst);
        std::endl<char,std::char_traits<char>>((ostream *)pQVar5);
      }
      if (bQueryPlans != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"PRINTING QUERY PLAN",0x13);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        pQVar5 = (QL_Manager *)topNode_00;
        (*topNode_00->_vptr_QL_Node[5])(topNode_00,0);
      }
      RVar1 = CleanUpNodes(pQVar5,topNode_00);
      if (RVar1 != 0) {
        return RVar1;
      }
      if (this->smm->printPageStats == true) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        SM_Manager::PrintPageStats(this->smm);
      }
      free(this->relEntries);
      free(this->attrEntries);
      return 0;
    }
    free(this->relEntries);
    pAVar6 = this->attrEntries;
  }
  else {
    pAVar6 = (AttrCatEntry *)this->relEntries;
  }
  free(pAVar6);
  return RVar1;
}

Assistant:

RC QL_Manager::Select(int nSelAttrs, const RelAttr selAttrs[],
                      int nRelations, const char * const relations[],
                      int nConditions, const Condition conditions[])
{
  int i;
  RC rc = 0;
  if(smm.printPageStats){
    smm.ResetPageStats();
  }

  cout << "Select\n";

  cout << "   nSelAttrs = " << nSelAttrs << "\n";
  for (i = 0; i < nSelAttrs; i++)
    cout << "   selAttrs[" << i << "]:" << selAttrs[i] << "\n";

  cout << "   nRelations = " << nRelations << "\n";
  for (i = 0; i < nRelations; i++)
    cout << "   relations[" << i << "] " << relations[i] << "\n";

  cout << "   nCondtions = " << nConditions << "\n";
  for (i = 0; i < nConditions; i++)
    cout << "   conditions[" << i << "]:" << conditions[i] << "\n";

  // Parse - relations have no duplicates
  if((rc = ParseRelNoDup(nRelations, relations)))
    return (rc);

  // Reset class query parameters
  Reset();
  nRels = nRelations;
  nConds = nConditions;
  condptr = conditions;

  // retrieve all relations
  relEntries = (RelCatEntry *)malloc(sizeof(RelCatEntry)*nRelations);
  memset((void*)relEntries, 0, sizeof(*relEntries));
  if((rc = smm.GetAllRels(relEntries, nRelations, relations, nAttrs, relToInt))){
    free(relEntries);
    return (rc);
  }

  // Retrieve all attributes
  attrEntries = (AttrCatEntry *)malloc(sizeof(AttrCatEntry)*nAttrs);
  int slot = 0;
  for(int i=0; i < nRelations; i++){
      string relString(relEntries[i].relName);
      relToAttrIndex.insert({relString, slot});
      if((rc = smm.GetAttrForRel(relEntries + i, attrEntries + slot, attrToRel))){
        free(relEntries);
        free(attrEntries);
        return (rc);
      }
      slot += relEntries[i].attrCount;
  }
  
  // Make sure the attributes and conditions are valid
  if((rc = ParseSelectAttrs(nSelAttrs, selAttrs))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }
  if((rc = ParseConditions(nConditions, conditions))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }
  /*
  QO_Manager *qom = new QO_Manager(*this, nRels, relEntries, nAttrs, attrEntries,
      nConds, condptr);
  QO_Rel * qorels = (QO_Rel*)(malloc(sizeof(QO_Rel)*nRels));
  for(int i=0; i < nRels; i++){
    *(qorels + i) = (QO_Rel){ 0.0, -1.0, -1.0};
  }
  qom->Compute(qorels);
  qom->PrintRels();
  delete qom;
  free(qorels);
  */
  QL_Node *topNode;
  float cost, tupleEst;
  if(smm.useQO){
    //cout << "using QO" << endl;
    QO_Manager *qom = new QO_Manager(*this, nRels, relEntries, nAttrs, attrEntries,
      nConds, condptr);
    QO_Rel * qorels = (QO_Rel*)(malloc(sizeof(QO_Rel)*nRels));
    for(int i=0; i < nRels; i++){
      *(qorels + i) = (QO_Rel){ 0, -1, -1};
    }
    qom->Compute(qorels, cost, tupleEst);
    qom->PrintRels();
    RecalcCondToRel(qorels);
    if((rc = SetUpNodesWithQO(topNode, qorels, nSelAttrs, selAttrs)))
      return (rc);
    /*
    for(int i=0; i < nRels; i++){
      int index = qorels[i].relIdx;
      cout << relEntries[index].relName << endl;
      cout << "  associated conds: ";
      for(int j=0; j < nConds; j++){
        if(conditionToRel[j] == index)
          cout << j;
        }
        cout << endl;
      }
      */

    delete qom;
    free(qorels);
  }
  else{
    // Construct the query tree
    if((rc = SetUpNodes(topNode, nSelAttrs, selAttrs)))
      return (rc);
  }

  

  //QL_Node *topNode;
  // Construct the query tree
  //if((rc = SetUpNodes(topNode, nSelAttrs, selAttrs)))
  //  return (rc);

  // Print the query tree
  

  
  // run select
  if((rc = RunSelect(topNode)))
    return (rc);

  if(smm.useQO){
    cout << "estimated cost: " << cost << endl;
    cout << "estimated # tuples: " << tupleEst << endl;
  }
    

  if(bQueryPlans){
    cout << "PRINTING QUERY PLAN" <<endl;
    topNode->PrintNode(0);
  }

  
  // clean up query tree
  if((rc = CleanUpNodes(topNode)))
    return (rc);

  if(smm.printPageStats){
    cout << endl;
    smm.PrintPageStats();
  }
    
  free(relEntries);
  free(attrEntries);

  return (rc);
}